

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
anon_unknown.dwarf_7002e::assignments_as_proof_decisions
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,Assignments *assignments)

{
  pointer ppVar1;
  pointer __args;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (assignments->assigned).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__args = (assignments->assigned).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; __args != ppVar1; __args = __args + 1) {
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<int_const&,int_const&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&__args->first,&__args->second);
  }
  return __return_storage_ptr__;
}

Assistant:

auto assignments_as_proof_decisions(const Assignments & assignments) -> vector<pair<int, int>>
    {
        vector<pair<int, int>> trail;
        for (auto & [l, r] : assignments.assigned)
            trail.emplace_back(l, r);
        return trail;
    }